

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcReconv.c
# Opt level: O2

Abc_ManCut_t *
Abc_NtkManCutStart(int nNodeSizeMax,int nConeSizeMax,int nNodeFanStop,int nConeFanStop)

{
  Abc_ManCut_t *pAVar1;
  Vec_Ptr_t *pVVar2;
  Vec_Vec_t *pVVar3;
  void **ppvVar4;
  
  pAVar1 = (Abc_ManCut_t *)calloc(1,0x38);
  pVVar2 = Vec_PtrAlloc(100);
  pAVar1->vNodeLeaves = pVVar2;
  pVVar2 = Vec_PtrAlloc(100);
  pAVar1->vConeLeaves = pVVar2;
  pVVar2 = Vec_PtrAlloc(100);
  pAVar1->vVisited = pVVar2;
  pVVar3 = (Vec_Vec_t *)malloc(0x10);
  pVVar3->nCap = 100;
  pVVar3->nSize = 0;
  ppvVar4 = (void **)malloc(800);
  pVVar3->pArray = ppvVar4;
  pAVar1->vLevels = pVVar3;
  pVVar2 = Vec_PtrAlloc(100);
  pAVar1->vNodesTfo = pVVar2;
  pAVar1->nNodeSizeMax = nNodeSizeMax;
  pAVar1->nConeSizeMax = nConeSizeMax;
  pAVar1->nNodeFanStop = nNodeFanStop;
  pAVar1->nConeFanStop = nConeFanStop;
  return pAVar1;
}

Assistant:

Abc_ManCut_t * Abc_NtkManCutStart( int nNodeSizeMax, int nConeSizeMax, int nNodeFanStop, int nConeFanStop )
{
    Abc_ManCut_t * p;
    p = ABC_ALLOC( Abc_ManCut_t, 1 );
    memset( p, 0, sizeof(Abc_ManCut_t) );
    p->vNodeLeaves  = Vec_PtrAlloc( 100 );
    p->vConeLeaves  = Vec_PtrAlloc( 100 );
    p->vVisited     = Vec_PtrAlloc( 100 );
    p->vLevels      = Vec_VecAlloc( 100 );
    p->vNodesTfo    = Vec_PtrAlloc( 100 );
    p->nNodeSizeMax = nNodeSizeMax;
    p->nConeSizeMax = nConeSizeMax;
    p->nNodeFanStop = nNodeFanStop;
    p->nConeFanStop = nConeFanStop;
    return p;
}